

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcPartialsPartialsAutoScaling
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,int *activateScaling)

{
  uint uVar1;
  float fVar2;
  float *pfVar3;
  float *pfVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int expTmp;
  int local_74;
  float *local_70;
  float *local_68;
  ulong local_60;
  float *local_58;
  float *local_50;
  float *local_48;
  ulong local_40;
  ulong local_38;
  
  local_70 = partials1;
  local_68 = partials2;
  local_58 = destP;
  local_50 = matrices1;
  local_48 = matrices2;
  for (local_60 = 0; (int)local_60 < this->kCategoryCount; local_60 = (ulong)((int)local_60 + 1)) {
    iVar9 = this->kPatternCount;
    uVar7 = (ulong)(uint)(this->kPartialsPaddedStateCount * (int)local_60 * iVar9);
    local_38 = uVar7;
    for (iVar6 = 0; pfVar4 = local_68, pfVar3 = local_70, iVar6 < iVar9; iVar6 = iVar6 + 1) {
      iVar8 = (int)uVar7;
      local_38 = (ulong)(int)local_38;
      iVar9 = 0;
      uVar10 = this->kMatrixSize * (int)local_60;
      while( true ) {
        local_40 = (ulong)uVar10;
        uVar1 = this->kStateCount;
        if ((int)uVar1 <= iVar9) break;
        auVar11 = ZEXT816(0) << 0x40;
        auVar12 = ZEXT816(0) << 0x40;
        for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
          auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)matrices1[(long)(int)uVar10 + uVar7]),
                                    ZEXT416((uint)pfVar3[(long)iVar8 + uVar7]));
          auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)matrices2[(long)(int)uVar10 + uVar7]),
                                    ZEXT416((uint)pfVar4[(long)iVar8 + uVar7]));
        }
        fVar2 = auVar11._0_4_ * auVar12._0_4_;
        destP[local_38] = fVar2;
        if (*activateScaling == 0) {
          frexp((double)fVar2,&local_74);
          iVar5 = -local_74;
          if (0 < local_74) {
            iVar5 = local_74;
          }
          if (this->scalingExponentThreshold < iVar5) {
            *activateScaling = 1;
          }
          uVar10 = (uint)local_40;
          destP = local_58;
          matrices1 = local_50;
          matrices2 = local_48;
        }
        uVar10 = uVar10 + 1 + uVar1;
        local_38 = local_38 + 1;
        iVar9 = iVar9 + 1;
      }
      iVar9 = this->kPatternCount;
      uVar7 = (ulong)(uint)(iVar8 + this->kPartialsPaddedStateCount);
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsAutoScaling(REALTYPE* destP,
                                                               const REALTYPE* partials1,
                                                               const REALTYPE* matrices1,
                                                               const REALTYPE* partials2,
                                                               const REALTYPE* matrices2,
                                                               int* activateScaling) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*kPartialsPaddedStateCount*kPatternCount;
        int v = l*kPartialsPaddedStateCount*kPatternCount;
        for (int k = 0; k < kPatternCount; k++) {
            int w = l * kMatrixSize;
            for (int i = 0; i < kStateCount; i++) {
                REALTYPE sum1 = 0.0, sum2 = 0.0;
                for (int j = 0; j < kStateCount; j++) {
                    sum1 += matrices1[w] * partials1[v + j];
                    sum2 += matrices2[w] * partials2[v + j];
                    w++;
                }

                // increment for the extra column at the end
                w += T_PAD;

                destP[u] = sum1 * sum2;

                if (*activateScaling == 0) {
                    int expTmp;
                    frexp(destP[u], &expTmp);
                    if (abs(expTmp) > scalingExponentThreshold)
                        *activateScaling = 1;
                }

                u++;
            }
            u += P_PAD;
            v += kPartialsPaddedStateCount;
        }
    }
}